

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draw.cpp
# Opt level: O0

Font * vera::getFont(string *_name)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_28;
  _Self local_20;
  iterator it;
  string *_name_local;
  
  it._M_node = (_Base_ptr)_name;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Font_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Font_*>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Font_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Font_*>_>_>
               *)(scene + 0x1a0),_name);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Font_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Font_*>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Font_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Font_*>_>_>
              *)(scene + 0x1a0));
  bVar1 = std::operator!=(&local_20,&local_28);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Font_*>_>
             ::operator->(&local_20);
    _name_local = (string *)ppVar2->second;
  }
  else {
    _name_local = (string *)0x0;
  }
  return (Font *)_name_local;
}

Assistant:

Font* getFont(const std::string& _name) { 
    FontsMap::iterator it = scene->fonts.find(_name);
    if (it != scene->fonts.end())
        return it->second;
    return nullptr;
}